

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::OutputFile::copyPixels(OutputFile *this,InputFile *in)

{
  LineOrder LVar1;
  Compression CVar2;
  OutputStreamMutex *filedata;
  bool bVar3;
  int iVar4;
  Header *this_00;
  ConstIterator CVar5;
  const_iterator cVar6;
  Box2i *pBVar7;
  Box2i *pBVar8;
  LineOrder *pLVar9;
  Compression *pCVar10;
  ChannelList *this_01;
  ChannelList *other;
  Data *pDVar11;
  ArgExc *pAVar12;
  char *pcVar13;
  ostream *poVar14;
  LogicExc *this_02;
  undefined4 in_ECX;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int pixelDataSize;
  stringstream _iex_throw_s;
  int local_1c4;
  pthread_mutex_t *local_1c0;
  char *local_1b8 [2];
  ostream local_1a8 [376];
  
  local_1c0 = (pthread_mutex_t *)this->_data->_streamData;
  iVar4 = pthread_mutex_lock(local_1c0);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  pDVar11 = this->_data;
  this_00 = InputFile::header(in);
  CVar5 = Header::find(this_00,"tiles");
  cVar6._M_node = (_Base_ptr)Header::end(this_00);
  if (CVar5._i._M_node != (const_iterator)cVar6._M_node) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Cannot copy pixels from image file \"",0x24);
    pcVar13 = InputFile::fileName(in);
    poVar14 = std::operator<<(local_1a8,pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar13 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,
               "\". The input file is tiled, but the output file is not. Try using TiledOutputFile::copyPixels instead."
               ,0x66);
    pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar12,(stringstream *)local_1b8);
    __cxa_throw(pAVar12,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pBVar7 = Header::dataWindow(&pDVar11->header);
  pBVar8 = Header::dataWindow(this_00);
  iVar4 = -(uint)((pBVar8->min).x == (pBVar7->min).x);
  iVar17 = -(uint)((pBVar8->min).y == (pBVar7->min).y);
  auVar15._4_4_ = iVar4;
  auVar15._0_4_ = iVar4;
  auVar15._8_4_ = iVar17;
  auVar15._12_4_ = iVar17;
  iVar4 = movmskpd(in_ECX,auVar15);
  if ((iVar4 != 3) ||
     (iVar4 = -(uint)((pBVar8->max).x == (pBVar7->max).x),
     iVar17 = -(uint)((pBVar8->max).y == (pBVar7->max).y), auVar16._4_4_ = iVar4,
     auVar16._0_4_ = iVar4, auVar16._8_4_ = iVar17, auVar16._12_4_ = iVar17,
     iVar4 = movmskpd((int)pBVar8,auVar16), iVar4 != 3)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Cannot copy pixels from image file \"",0x24);
    pcVar13 = InputFile::fileName(in);
    poVar14 = std::operator<<(local_1a8,pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar13 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\". The files have different data windows.",0x29);
    pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar12,(stringstream *)local_1b8);
    __cxa_throw(pAVar12,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pLVar9 = Header::lineOrder(&pDVar11->header);
  LVar1 = *pLVar9;
  pLVar9 = Header::lineOrder(this_00);
  if (LVar1 != *pLVar9) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar13 = InputFile::fileName(in);
    poVar14 = std::operator<<(local_1a8,pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar13 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" failed. The files have different line orders.",0x2f);
    pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar12,(stringstream *)local_1b8);
    __cxa_throw(pAVar12,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pCVar10 = Header::compression(&pDVar11->header);
  CVar2 = *pCVar10;
  pCVar10 = Header::compression(this_00);
  if (CVar2 == *pCVar10) {
    this_01 = Header::channels(&pDVar11->header);
    other = Header::channels(this_00);
    bVar3 = ChannelList::operator==(this_01,other);
    if (!bVar3) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Quick pixel copy from image file \"",0x22);
      pcVar13 = InputFile::fileName(in);
      poVar14 = std::operator<<(local_1a8,pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
      pcVar13 = OStream::fileName(this->_data->_streamData->os);
      poVar14 = std::operator<<(poVar14,pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"\" failed.  The files have different channel lists.",0x32);
      pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar12,(stringstream *)local_1b8);
      __cxa_throw(pAVar12,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    pBVar7 = Header::dataWindow(&pDVar11->header);
    if (this->_data->missingScanLines == ((pBVar7->max).y - (pBVar7->min).y) + 1) {
      pDVar11 = this->_data;
      if (0 < pDVar11->missingScanLines) {
        do {
          InputFile::rawPixelData(in,pDVar11->currentScanLine,local_1b8,&local_1c4);
          pDVar11 = this->_data;
          filedata = pDVar11->_streamData;
          iVar4 = lineBufferMinY(pDVar11->currentScanLine,pDVar11->minY,pDVar11->linesInBuffer);
          anon_unknown_7::writePixelData(filedata,pDVar11,iVar4,local_1b8[0],local_1c4);
          pDVar11 = this->_data;
          iVar4 = pDVar11->linesInBuffer;
          iVar17 = -iVar4;
          if (pDVar11->lineOrder == INCREASING_Y) {
            iVar17 = iVar4;
          }
          pDVar11->currentScanLine = pDVar11->currentScanLine + iVar17;
          pDVar11->missingScanLines = pDVar11->missingScanLines - iVar4;
          pDVar11 = this->_data;
        } while (0 < pDVar11->missingScanLines);
      }
      pthread_mutex_unlock(local_1c0);
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar13 = InputFile::fileName(in);
    poVar14 = std::operator<<(local_1a8,pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar13 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" failed. \"",0xb);
    pcVar13 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" already contains pixel data.",0x1e);
    this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::LogicExc::LogicExc(this_02,(stringstream *)local_1b8);
    __cxa_throw(this_02,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"Quick pixel copy from image file \"",0x22);
  pcVar13 = InputFile::fileName(in);
  poVar14 = std::operator<<(local_1a8,pcVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
  pcVar13 = OStream::fileName(this->_data->_streamData->os);
  poVar14 = std::operator<<(poVar14,pcVar13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,"\" failed. The files use different compression methods.",0x36);
  pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar12,(stringstream *)local_1b8);
  __cxa_throw(pAVar12,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void	
OutputFile::copyPixels (InputFile &in)
{
    Lock lock (*_data->_streamData);

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header &hdr = _data->header;
    const Header &inHdr = in.header();

    if (inHdr.find("tiles") != inHdr.end())
	THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\". "
                            "The input file is tiled, but the output file is "
                            "not. Try using TiledOutputFile::copyPixels "
                            "instead.");

    if (!(hdr.dataWindow() == inHdr.dataWindow()))
	THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\". "
                            "The files have different data windows.");

    if (!(hdr.lineOrder() == inHdr.lineOrder()))
	THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files have different line orders.");

    if (!(hdr.compression() == inHdr.compression()))
	THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files use different compression methods.");

    if (!(hdr.channels() == inHdr.channels()))
	THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed.  "
			    "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i &dataWindow = hdr.dataWindow();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
	THROW (IEX_NAMESPACE::LogicExc, "Quick pixel copy from image "
			      "file \"" << in.fileName() << "\" to image "
			      "file \"" << fileName() << "\" failed. "
			      "\"" << fileName() << "\" already contains "
			      "pixel data.");

    //
    // Copy the pixel data.
    //

    while (_data->missingScanLines > 0)
    {
	const char *pixelData;
	int pixelDataSize;

	in.rawPixelData (_data->currentScanLine, pixelData, pixelDataSize);

        writePixelData (_data->_streamData, _data, lineBufferMinY (_data->currentScanLine,
                                               _data->minY,
                                               _data->linesInBuffer),
                        pixelData, pixelDataSize);

	_data->currentScanLine += (_data->lineOrder == INCREASING_Y)?
				   _data->linesInBuffer: -_data->linesInBuffer;

	_data->missingScanLines -= _data->linesInBuffer;
    }
}